

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O1

void __thiscall groundupdbext::FileKeyValueStore::Impl::Impl(Impl *this,string *fullpath)

{
  pointer pcVar1;
  
  (this->m_fullpath)._M_dataplus._M_p = (pointer)&(this->m_fullpath).field_2;
  pcVar1 = (fullpath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + fullpath->_M_string_length);
  HighwayHash::HighwayHash(&this->m_hasher);
  return;
}

Assistant:

FileKeyValueStore::Impl::Impl(std::string fullpath)
  : m_fullpath(fullpath), m_hasher()
{
  ;
}